

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_up_global_failure_tests.cpp
# Opt level: O0

void __thiscall SetUpFailureEnvironment::~SetUpFailureEnvironment(SetUpFailureEnvironment *this)

{
  SetUpFailureEnvironment *this_local;
  
  iutest::Environment::~Environment(&this->super_Environment);
  return;
}

Assistant:

class SetUpFailureEnvironment IUTEST_CXX_FINAL : public ::iutest::Environment
{
private:
    virtual void SetUp(void) IUTEST_CXX_OVERRIDE
    {
        if( setup_failure )
        {
            IUTEST_FAIL();
        }
    }
};

class TearDownFailureEnvironment IUTEST_CXX_FINAL : public ::iutest::Environment
{
private:
    virtual void TearDown(void) IUTEST_CXX_OVERRIDE
    {
        IUTEST_FAIL();
    }
}